

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O1

int notRecursiveHugeTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  
  nb_tests = nb_tests + 1;
  plVar3 = (long *)xmlNewParserCtxt();
  if ((options & 1U) != 0) {
    lVar4 = *plVar3;
    *(undefined8 *)(lVar4 + 200) = 0;
    *(undefined8 *)(lVar4 + 0x70) = 0;
    *(undefined8 *)(lVar4 + 0x78) = 0;
    *(undefined8 *)(lVar4 + 0x88) = 0;
    *(undefined8 *)(lVar4 + 0x90) = 0;
    *(undefined8 *)(lVar4 + 0x98) = 0;
    *(undefined8 *)(lVar4 + 0xa0) = 0;
    *(undefined8 *)(lVar4 + 0xe8) = 0;
    *(undefined8 *)(lVar4 + 0xf0) = 0;
  }
  lVar4 = xmlCtxtReadFile(plVar3,"test/recurse/huge.xml",0,options & 2U ^ 0x12);
  if (lVar4 == 0) {
    notRecursiveHugeTest_cold_1();
  }
  else {
    iVar1 = xmlStrlen("some internal data");
    lVar5 = xmlGetDocEntity(lVar4,"e");
    iVar2 = xmlStrlen("&f;");
    lVar8 = (long)(iVar2 * 2) + (long)iVar1 * 2 + 0x28;
    lVar5 = *(long *)(lVar5 + 0x88);
    if (lVar5 != lVar8) {
      fprintf(_stderr,"Wrong size for entity e: %lu (expected %lu)\n",lVar5,lVar8);
    }
    uVar6 = (uint)(lVar5 != lVar8);
    lVar5 = xmlGetDocEntity(lVar4,"b");
    if (*(long *)(lVar5 + 0x88) != lVar8) {
      fprintf(_stderr,"Wrong size for entity b: %lu (expected %lu)\n",*(long *)(lVar5 + 0x88),lVar8)
      ;
      uVar6 = 1;
    }
    lVar5 = xmlGetDocEntity(lVar4,"d");
    iVar2 = xmlStrlen("&e;");
    lVar7 = (long)(iVar2 * 2) + lVar8 * 2 + 0x28;
    if (*(long *)(lVar5 + 0x88) != lVar7) {
      fprintf(_stderr,"Wrong size for entity d: %lu (expected %lu)\n",*(long *)(lVar5 + 0x88),lVar7)
      ;
      uVar6 = 1;
    }
    lVar5 = xmlGetDocEntity(lVar4,"c");
    if (*(long *)(lVar5 + 0x88) != lVar7) {
      fprintf(_stderr,"Wrong size for entity c: %lu (expected %lu)\n",*(long *)(lVar5 + 0x88),lVar7)
      ;
      uVar6 = 1;
    }
    if ((ulong)plVar3[0x5d] < 1000000) {
      fprintf(_stderr,"Total entity size too small: %lu\n");
      uVar6 = 1;
    }
    if (plVar3[0x5d] != (lVar8 + iVar1 + lVar7) * 0xbb5 + 0x2be6c) {
      fprintf(_stderr,"Wrong total entity size: %lu (expected %lu)\n");
      uVar6 = 1;
    }
    if (plVar3[0x58] == 0x1e) goto LAB_00102d16;
    fprintf(_stderr,"Wrong parsed entity size: %lu (expected %lu)\n",plVar3[0x58],0x1e);
  }
  uVar6 = 1;
LAB_00102d16:
  xmlFreeDoc(lVar4);
  xmlFreeParserCtxt(plVar3);
  return uVar6;
}

Assistant:

static int
notRecursiveHugeTest(const char *filename ATTRIBUTE_UNUSED,
             const char *result ATTRIBUTE_UNUSED,
             const char *err ATTRIBUTE_UNUSED,
	     int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    int res = 0;
    int parserOptions = XML_PARSE_DTDVALID;

    nb_tests++;

    ctxt = xmlNewParserCtxt();
    if (options & OPT_SAX)
        initSAX(ctxt);
    if ((options & OPT_NO_SUBST) == 0)
        parserOptions |= XML_PARSE_NOENT;
    doc = xmlCtxtReadFile(ctxt, "test/recurse/huge.xml", NULL, parserOptions);
    if (doc == NULL) {
        fprintf(stderr, "Failed to parse huge.xml\n");
	res = 1;
    } else {
        xmlEntityPtr ent;
        unsigned long fixed_cost = 20;
        unsigned long allowed_expansion = 1000000;
        unsigned long f_size = xmlStrlen(BAD_CAST "some internal data");
        unsigned long e_size;
        unsigned long d_size;
        unsigned long total_size;

        ent = xmlGetDocEntity(doc, BAD_CAST "e");
        e_size = f_size * 2 +
                 xmlStrlen(BAD_CAST "&f;") * 2 +
                 fixed_cost * 2;
        if (ent->expandedSize != e_size) {
            fprintf(stderr, "Wrong size for entity e: %lu (expected %lu)\n",
                    ent->expandedSize, e_size);
            res = 1;
        }

        ent = xmlGetDocEntity(doc, BAD_CAST "b");
        if (ent->expandedSize != e_size) {
            fprintf(stderr, "Wrong size for entity b: %lu (expected %lu)\n",
                    ent->expandedSize, e_size);
            res = 1;
        }

        ent = xmlGetDocEntity(doc, BAD_CAST "d");
        d_size = e_size * 2 +
                 xmlStrlen(BAD_CAST "&e;") * 2 +
                 fixed_cost * 2;
        if (ent->expandedSize != d_size) {
            fprintf(stderr, "Wrong size for entity d: %lu (expected %lu)\n",
                    ent->expandedSize, d_size);
            res = 1;
        }

        ent = xmlGetDocEntity(doc, BAD_CAST "c");
        if (ent->expandedSize != d_size) {
            fprintf(stderr, "Wrong size for entity c: %lu (expected %lu)\n",
                    ent->expandedSize, d_size);
            res = 1;
        }

        if (ctxt->sizeentcopy < allowed_expansion) {
            fprintf(stderr, "Total entity size too small: %lu\n",
                    ctxt->sizeentcopy);
            res = 1;
        }

        total_size = (f_size + e_size + d_size + 3 * fixed_cost) *
                     (MAX_NODES - 1) * 3;
        if (ctxt->sizeentcopy != total_size) {
            fprintf(stderr, "Wrong total entity size: %lu (expected %lu)\n",
                    ctxt->sizeentcopy, total_size);
            res = 1;
        }

        if (ctxt->sizeentities != 30) {
            fprintf(stderr, "Wrong parsed entity size: %lu (expected %lu)\n",
                    ctxt->sizeentities, 30lu);
            res = 1;
        }
    }

    xmlFreeDoc(doc);
    xmlFreeParserCtxt(ctxt);

    return(res);
}